

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_window.c
# Opt level: O0

void fitToMonitor(_GLFWwindow *window)

{
  undefined1 local_28 [8];
  GLFWvidmode mode;
  _GLFWwindow *window_local;
  
  mode._16_8_ = window;
  _glfwGetVideoModeNull(window->monitor,(GLFWvidmode *)local_28);
  _glfwGetMonitorPosNull
            (*(_GLFWmonitor **)(mode._16_8_ + 0x50),(int *)(mode._16_8_ + 0xba8),
             (int *)(mode._16_8_ + 0xbac));
  *(undefined4 *)(mode._16_8_ + 0xbb0) = local_28._0_4_;
  *(undefined4 *)(mode._16_8_ + 0xbb4) = local_28._4_4_;
  return;
}

Assistant:

static void fitToMonitor(_GLFWwindow* window)
{
    GLFWvidmode mode;
    _glfwGetVideoModeNull(window->monitor, &mode);
    _glfwGetMonitorPosNull(window->monitor,
                           &window->null.xpos,
                           &window->null.ypos);
    window->null.width = mode.width;
    window->null.height = mode.height;
}